

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

void lj_ffrecord_func(jit_State *J)

{
  uint32_t uVar1;
  jit_State *in_RDI;
  uint32_t m;
  RecordFFData rd;
  ptrdiff_t in_stack_00000060;
  BCReg in_stack_0000006c;
  jit_State *in_stack_00000070;
  RecordFFData local_20;
  jit_State *local_8;
  
  local_8 = in_RDI;
  uVar1 = recdef_lookup(in_RDI->fn);
  local_20.data = uVar1 & 0xff;
  local_20.nres = 1;
  local_20.argv = local_8->L->base;
  local_8->base[local_8->maxslot] = 0;
  (*recff_func[uVar1 >> 8])(local_8,&local_20);
  if (-1 < local_20.nres) {
    if (local_8->postproc == LJ_POST_NONE) {
      local_8->postproc = LJ_POST_FFRETRY;
    }
    lj_record_ret(in_stack_00000070,in_stack_0000006c,in_stack_00000060);
  }
  return;
}

Assistant:

void lj_ffrecord_func(jit_State *J)
{
  RecordFFData rd;
  uint32_t m = recdef_lookup(J->fn);
  rd.data = m & 0xff;
  rd.nres = 1;  /* Default is one result. */
  rd.argv = J->L->base;
  J->base[J->maxslot] = 0;  /* Mark end of arguments. */
  (recff_func[m >> 8])(J, &rd);  /* Call recff_* handler. */
  if (rd.nres >= 0) {
    if (J->postproc == LJ_POST_NONE) J->postproc = LJ_POST_FFRETRY;
    lj_record_ret(J, 0, rd.nres);
  }
}